

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getLinkId(int index,char *id,Network *nw)

{
  int iVar1;
  char *__src;
  char *__to;
  Network *nw_local;
  char *id_local;
  int index_local;
  
  if ((-1 < index) && (iVar1 = Network::count(nw,LINK), index < iVar1)) {
    Network::link(nw,(char *)(ulong)(uint)index,__to);
    __src = (char *)std::__cxx11::string::c_str();
    strcpy(id,__src);
    return 0;
  }
  strcpy(id,"");
  return 0xcd;
}

Assistant:

int DataManager::getLinkId(int index, char* id, Network* nw)
{
    if ( index < 0 || index >= nw->count(Element::LINK) )
    {
        strcpy(id, "");
        return 205;
    }
    strcpy(id, nw->link(index)->name.c_str());
    return 0;
}